

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O3

DdNode * Cudd_Inequality(DdManager *dd,int N,int c,DdNode **x,DdNode **y)

{
  int *piVar1;
  DdNode *pDVar2;
  int iVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  DdNode *g;
  int iVar9;
  int iVar10;
  int iVar11;
  DdNode *pDVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  DdNode *n;
  int iVar17;
  int iVar18;
  int iVar19;
  DdNode *n_00;
  int iVar20;
  bool bVar21;
  int local_104;
  DdNode *local_100;
  DdNode *local_f8;
  DdNode *local_c8;
  
  pDVar2 = dd->one;
  pDVar12 = (DdNode *)((ulong)pDVar2 ^ 1);
  iVar20 = 1 << ((byte)N - 1 & 0x1f);
  if (N < 0) {
LAB_0079008c:
    local_c8 = (DdNode *)0x0;
  }
  else if (N == 0) {
    local_c8 = pDVar2;
    if (c < 0) {
      local_c8 = pDVar12;
    }
  }
  else {
    iVar13 = 1 << ((byte)N & 0x1f);
    local_c8 = pDVar12;
    if ((c < iVar13) && (local_c8 = pDVar2, 1 - iVar13 < c)) {
      uVar16 = 1;
      uVar6 = 1;
      local_c8 = (DdNode *)0x0;
      local_100 = (DdNode *)0x0;
      local_f8 = (DdNode *)0x0;
      local_104 = c + -1;
      iVar19 = c;
      iVar13 = iVar20;
      iVar14 = iVar20;
      do {
        iVar8 = c + -1 >> ((byte)uVar6 & 0x1f);
        bVar21 = (uVar16 & c) != 1;
        iVar10 = c >> ((byte)uVar6 & 0x1f);
        iVar15 = iVar20;
        if ((int)(iVar8 + (uint)bVar21) < iVar10) {
          pDVar5 = (DdNode *)0x0;
          n_00 = (DdNode *)0x0;
          iVar18 = iVar20;
        }
        else {
          lVar7 = (uint)N - uVar6;
          iVar3 = 1 << ((byte)lVar7 & 0x1f);
          iVar9 = iVar10 * 2;
          n_00 = (DdNode *)0x0;
          n = (DdNode *)0x0;
          iVar11 = iVar10;
          iVar17 = iVar20;
          do {
            pDVar5 = n;
            iVar18 = iVar17;
            if ((iVar11 < iVar3) && (-iVar3 < iVar11)) {
              pDVar5 = pDVar2;
              if ((iVar9 <= iVar19) && (pDVar5 = pDVar12, local_104 < iVar9 + -1)) {
                if ((iVar13 + 1 != iVar9) && (iVar14 + 1 != iVar9)) {
                  __assert_fail("leftChild == index[0] || leftChild == index[1]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                                ,0x331,
                                "DdNode *Cudd_Inequality(DdManager *, int, int, DdNode **, DdNode **)"
                               );
                }
                pDVar5 = local_f8;
                if (iVar13 + 1 == iVar9) {
                  pDVar5 = local_100;
                }
              }
              g = pDVar2;
              if ((iVar9 < iVar19) && (g = pDVar12, local_104 < iVar9)) {
                if ((iVar13 != iVar9) && (iVar14 != iVar9)) {
                  __assert_fail("middleChild == index[0] || middleChild == index[1]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                                ,0x340,
                                "DdNode *Cudd_Inequality(DdManager *, int, int, DdNode **, DdNode **)"
                               );
                }
                g = local_f8;
                if (iVar13 == iVar9) {
                  g = local_100;
                }
              }
              pDVar4 = pDVar2;
              if ((iVar9 + 1 < iVar19) && (pDVar4 = pDVar12, local_104 <= iVar9)) {
                if ((iVar13 + -1 != iVar9) && (iVar14 + -1 != iVar9)) {
                  __assert_fail("rightChild == index[0] || rightChild == index[1]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                                ,0x34f,
                                "DdNode *Cudd_Inequality(DdManager *, int, int, DdNode **, DdNode **)"
                               );
                }
                pDVar4 = local_f8;
                if (iVar13 + -1 == iVar9) {
                  pDVar4 = local_100;
                }
              }
              pDVar4 = Cudd_bddIte(dd,y[lVar7],g,pDVar4);
              if (pDVar4 != (DdNode *)0x0) {
                piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + 1;
                pDVar5 = Cudd_bddIte(dd,y[lVar7],pDVar5,g);
                if (pDVar5 != (DdNode *)0x0) {
                  piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
                  *piVar1 = *piVar1 + 1;
                  local_c8 = Cudd_bddIte(dd,x[lVar7],pDVar4,pDVar5);
                  if (local_c8 != (DdNode *)0x0) {
                    piVar1 = (int *)(((ulong)local_c8 & 0xfffffffffffffffe) + 4);
                    *piVar1 = *piVar1 + 1;
                    Cudd_IterDerefBdd(dd,pDVar4);
                    Cudd_IterDerefBdd(dd,pDVar5);
                    if (iVar15 != iVar20 && iVar17 != iVar20) {
                      __assert_fail("newIndex[0] == invalidIndex || newIndex[1] == invalidIndex",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                                    ,0x37a,
                                    "DdNode *Cudd_Inequality(DdManager *, int, int, DdNode **, DdNode **)"
                                   );
                    }
                    pDVar5 = local_c8;
                    iVar18 = iVar11;
                    if (iVar17 != iVar20) {
                      pDVar5 = n;
                      n_00 = local_c8;
                      iVar18 = iVar17;
                      iVar15 = iVar11;
                    }
                    goto LAB_0078ff13;
                  }
                  Cudd_IterDerefBdd(dd,pDVar4);
                  pDVar4 = pDVar5;
                }
                Cudd_IterDerefBdd(dd,pDVar4);
              }
              if (iVar13 != iVar20) {
                Cudd_IterDerefBdd(dd,local_100);
              }
              if (iVar14 != iVar20) {
                Cudd_IterDerefBdd(dd,local_f8);
              }
              if (iVar17 != iVar20) {
                Cudd_IterDerefBdd(dd,n);
              }
              if (iVar15 != iVar20) {
                Cudd_IterDerefBdd(dd,n_00);
              }
              goto LAB_0079008c;
            }
LAB_0078ff13:
            iVar11 = iVar11 + 1;
            iVar9 = iVar9 + 2;
            n = pDVar5;
            iVar17 = iVar18;
          } while (iVar8 + (uint)bVar21 + 1 != iVar11);
        }
        if (iVar13 != iVar20) {
          Cudd_IterDerefBdd(dd,local_100);
        }
        if (iVar14 != iVar20) {
          Cudd_IterDerefBdd(dd,local_f8);
        }
        iVar19 = iVar8 + (uint)bVar21 + 1;
        uVar16 = uVar16 * 2 + 1;
        local_104 = iVar10 + -1;
        uVar6 = uVar6 + 1;
        local_100 = pDVar5;
        local_f8 = n_00;
        iVar13 = iVar18;
        iVar14 = iVar15;
      } while (uVar6 != N + 1);
      piVar1 = (int *)(((ulong)local_c8 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
    }
  }
  return local_c8;
}

Assistant:

DdNode *
Cudd_Inequality(
  DdManager * dd /* DD manager */,
  int  N /* number of x and y variables */,
  int c /* right-hand side constant */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */)
{
    /* The nodes at level i represent values of the difference that are
    ** multiples of 2^i.  We use variables with names starting with k
    ** to denote the multipliers of 2^i in such multiples. */
    int kTrue = c;
    int kFalse = c - 1;
    /* Mask used to compute the ceiling function.  Since we divide by 2^i,
    ** we want to know whether the dividend is a multiple of 2^i.  If it is,
    ** then ceiling and floor coincide; otherwise, they differ by one. */
    int mask = 1;
    int i;

    DdNode *f = NULL;           /* the eventual result */
    DdNode *one = DD_ONE(dd);
    DdNode *zero = Cudd_Not(one);

    /* Two x-labeled nodes are created at most at each iteration.  They are
    ** stored, along with their k values, in these variables.  At each level,
    ** the old nodes are freed and the new nodes are copied into the old map.
    */
    DdNode *map[2] = {0};
    int invalidIndex = 1 << (N-1);
    int index[2] = {invalidIndex, invalidIndex};

    /* This should never happen. */
    if (N < 0) return(NULL);

    /* If there are no bits, both operands are 0.  The result depends on c. */
    if (N == 0) {
        if (c >= 0) return(one);
        else return(zero);
    }

    /* The maximum or the minimum difference comparing to c can generate the terminal case */
    if ((1 << N) - 1 < c) return(zero);
    else if ((-(1 << N) + 1) >= c) return(one);

    /* Build the result bottom up. */
    for (i = 1; i <= N; i++) {
        int kTrueLower, kFalseLower;
        int leftChild, middleChild, rightChild;
        DdNode *g0, *g1, *fplus, *fequal, *fminus;
        int j;
        DdNode *newMap[2] = {NULL};
        int newIndex[2];

        kTrueLower = kTrue;
        kFalseLower = kFalse;
        /* kTrue = ceiling((c-1)/2^i) + 1 */
        kTrue = ((c-1) >> i) + ((c & mask) != 1) + 1;
        mask = (mask << 1) | 1;
        /* kFalse = floor(c/2^i) - 1 */
        kFalse = (c >> i) - 1;
        newIndex[0] = invalidIndex;
        newIndex[1] = invalidIndex;

        for (j = kFalse + 1; j < kTrue; j++) {
            /* Skip if node is not reachable from top of BDD. */
            if ((j >= (1 << (N - i))) || (j <= -(1 << (N -i)))) continue;

            /* Find f- */
            leftChild = (j << 1) - 1;
            if (leftChild >= kTrueLower) {
                fminus = one;
            } else if (leftChild <= kFalseLower) {
                fminus = zero;
            } else {
                assert(leftChild == index[0] || leftChild == index[1]);
                if (leftChild == index[0]) {
                    fminus = map[0];
                } else {
                    fminus = map[1];
                }
            }

            /* Find f= */
            middleChild = j << 1;
            if (middleChild >= kTrueLower) {
                fequal = one;
            } else if (middleChild <= kFalseLower) {
                fequal = zero;
            } else {
                assert(middleChild == index[0] || middleChild == index[1]);
                if (middleChild == index[0]) {
                    fequal = map[0];
                } else {
                    fequal = map[1];
                }
            }

            /* Find f+ */
            rightChild = (j << 1) + 1;
            if (rightChild >= kTrueLower) {
                fplus = one;
            } else if (rightChild <= kFalseLower) {
                fplus = zero;
            } else {
                assert(rightChild == index[0] || rightChild == index[1]);
                if (rightChild == index[0]) {
                    fplus = map[0];
                } else {
                    fplus = map[1];
                }
            }

            /* Build new nodes. */
            g1 = Cudd_bddIte(dd, y[N - i], fequal, fplus);
            if (g1 == NULL) {
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(g1);
            g0 = Cudd_bddIte(dd, y[N - i], fminus, fequal);
            if (g0 == NULL) {
                Cudd_IterDerefBdd(dd, g1);
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(g0);
            f = Cudd_bddIte(dd, x[N - i], g1, g0);
            if (f == NULL) {
                Cudd_IterDerefBdd(dd, g1);
                Cudd_IterDerefBdd(dd, g0);
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(f);
            Cudd_IterDerefBdd(dd, g1);
            Cudd_IterDerefBdd(dd, g0);

            /* Save newly computed node in map. */
            assert(newIndex[0] == invalidIndex || newIndex[1] == invalidIndex);
            if (newIndex[0] == invalidIndex) {
                newIndex[0] = j;
                newMap[0] = f;
            } else {
                newIndex[1] = j;
                newMap[1] = f;
            }
        }

        /* Copy new map to map. */
        if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
        if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
        map[0] = newMap[0];
        map[1] = newMap[1];
        index[0] = newIndex[0];
        index[1] = newIndex[1];
    }

    cuddDeref(f);
    return(f);

}